

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_libapi.cpp
# Opt level: O0

ze_result_t zesPowerSetEnergyThreshold(zes_pwr_handle_t hPower,double threshold)

{
  zes_pfnPowerSetEnergyThreshold_t p_Var1;
  __pointer_type p_Var2;
  zes_pfnPowerSetEnergyThreshold_t pfnSetEnergyThreshold;
  double threshold_local;
  zes_pwr_handle_t hPower_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_zes_dditable_t_*>::load
                       ((atomic<_zes_dditable_t_*> *)(ze_lib::context + 0x20),memory_order_seq_cst);
    p_Var1 = (p_Var2->Power).pfnSetEnergyThreshold;
    if (p_Var1 == (zes_pfnPowerSetEnergyThreshold_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hPower_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hPower_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hPower_local._4_4_ = (*p_Var1)(hPower,threshold);
    }
  }
  else {
    hPower_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hPower_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zesPowerSetEnergyThreshold(
    zes_pwr_handle_t hPower,                        ///< [in] Handle for the component.
    double threshold                                ///< [in] The energy threshold to be set in joules.
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const zes_pfnPowerSetEnergyThreshold_t pfnSetEnergyThreshold = [&result] {
        auto pfnSetEnergyThreshold = ze_lib::context->zesDdiTable.load()->Power.pfnSetEnergyThreshold;
        if( nullptr == pfnSetEnergyThreshold ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnSetEnergyThreshold;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnSetEnergyThreshold( hPower, threshold );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnSetEnergyThreshold = ze_lib::context->zesDdiTable.load()->Power.pfnSetEnergyThreshold;
    if( nullptr == pfnSetEnergyThreshold ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnSetEnergyThreshold( hPower, threshold );
    #endif
}